

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

JsValueRef
WScriptJsrt::SleepCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  double local_50;
  double timeout;
  JsValueRef pvStack_40;
  JsErrorCode errorCode;
  JsValueRef returnValue;
  void *pvStack_30;
  HRESULT hr;
  void *callbackState_local;
  JsValueRef *ppvStack_20;
  unsigned_short argumentCount_local;
  JsValueRef *arguments_local;
  JsValueRef pvStack_10;
  bool isConstructCall_local;
  JsValueRef callee_local;
  
  returnValue._4_4_ = 0x80004005;
  pvStack_40 = (JsValueRef)0x0;
  timeout._4_4_ = 0;
  pvStack_30 = callbackState;
  callbackState_local._6_2_ = argumentCount;
  ppvStack_20 = arguments;
  arguments_local._7_1_ = isConstructCall;
  pvStack_10 = callee;
  timeout._4_4_ = ChakraRTInterface::JsGetUndefinedValue(&stack0xffffffffffffffc0);
  if ((timeout._4_4_ == JsNoError) && (1 < callbackState_local._6_2_)) {
    local_50 = 0.0;
    ChakraRTInterface::JsNumberToDouble(ppvStack_20[1],&local_50);
    Sleep((DWORD)(long)local_50);
  }
  return pvStack_40;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::SleepCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));

    if (argumentCount > 1)
    {
        double timeout = 0.0;
        ChakraRTInterface::JsNumberToDouble(arguments[1], &timeout);
        Sleep((DWORD)timeout);
    }

Error:
    return returnValue;
}